

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O0

bool ptrie_insert(PTrie *ptrie,uintptr_t key,uintptr_t value)

{
  PTrieNode *pPVar1;
  ulong uVar2;
  uint uVar3;
  size_t sVar4;
  void *pvVar5;
  byte bVar6;
  int branch;
  int prefixEnd;
  uint b;
  uint index;
  uintptr_t pkey;
  uintptr_t x;
  uintptr_t *prevKey;
  PTrieNode *n;
  PTrieNode **node;
  PTrieNode *newNode;
  uintptr_t value_local;
  uintptr_t key_local;
  PTrie *ptrie_local;
  
  spinlock_acquire(&ptrie->lock);
  if (ptrie->freeNodesList == (PTrieNode *)0x0) {
    if (ptrie->newAllocatedPage == (PTrieNode *)0x0) {
      ptrie->lock = 0;
      sVar4 = page_size();
      pvVar5 = mmap((void *)0x0,sVar4,3,0x22,-1,0);
      node = (PTrieNode **)((long)pvVar5 + 1U & 0xfffffffffffffffe);
      if (node == (PTrieNode **)0x0) {
        return false;
      }
      sVar4 = page_size();
      if (*(long *)((long)node + (sVar4 - 8)) != 0) {
        __assert_fail("((char**)((char*)newNode + page_size()))[-1] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                      ,0x21b,"bool ptrie_insert(PTrie *, uintptr_t, uintptr_t)");
      }
      spinlock_acquire(&ptrie->lock);
      pPVar1 = ptrie->newAllocatedPage;
      sVar4 = page_size();
      *(PTrieNode **)((long)node + (sVar4 - 8)) = pPVar1;
      ptrie->newAllocatedPage = (PTrieNode *)(node + 4);
    }
    else {
      node = (PTrieNode **)ptrie->newAllocatedPage;
      pPVar1 = ptrie->newAllocatedPage;
      ptrie->newAllocatedPage = pPVar1 + 1;
      sVar4 = page_size();
      if (((ulong)(pPVar1 + 1) & sVar4 - 1) == 0) {
        ptrie->newAllocatedPage = ptrie->newAllocatedPage[-1].childNodes[1];
      }
    }
  }
  else {
    node = (PTrieNode **)ptrie->freeNodesList;
    ptrie->freeNodesList = (PTrieNode *)((PTrieNode *)node)->keys[0];
  }
  x = 0;
  n = (PTrieNode *)ptrie;
  if ((value & 1) != 0 || (key & 0xff) != 0) {
    __assert_fail("!((value & 1) | (key & 0xFF))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                  ,0x224,"bool ptrie_insert(PTrie *, uintptr_t, uintptr_t)");
  }
  do {
    pPVar1 = (PTrieNode *)n->keys[0];
    if (((ulong)pPVar1 & 1) != 0) {
      if (n->keys[0] == 1) {
        n->keys[0] = (uintptr_t)node;
        *node = (PTrieNode *)key;
        node[2] = (PTrieNode *)(value | 1);
        node[3] = (PTrieNode *)&DAT_00000001;
        ptrie->lock = 0;
      }
      else {
        _b = (PTrieNode *)(*(ulong *)x & 0xffffffffffffff00);
        pkey = key ^ (ulong)_b;
        if (pkey == 0) {
          __assert_fail("x && \"key already inserted\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                        ,0x242,"bool ptrie_insert(PTrie *, uintptr_t, uintptr_t)");
        }
LAB_00188d9d:
        uVar2 = 0x3f;
        if (pkey != 0) {
          for (; pkey >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        uVar3 = (uint)((key >> (uVar2 & 0x3f) & 1) != 0);
        node[uVar3] = (PTrieNode *)key;
        node[uVar3 ^ 1] = _b;
        *node = (PTrieNode *)((ulong)*node | uVar2 & 0xffffffff);
        node[(ulong)uVar3 + 2] = (PTrieNode *)(value | 1);
        node[(ulong)(uVar3 ^ 1) + 2] = pPVar1;
        n->keys[0] = (uintptr_t)node;
        ptrie->lock = 0;
      }
      return true;
    }
    pkey = key ^ pPVar1->keys[0];
    bVar6 = (byte)pPVar1->keys[0];
    if ((pkey & -2L << (bVar6 & 0x3f)) != 0) {
      _b = (PTrieNode *)(pPVar1->keys[0] & 0xffffffffffffff00);
      goto LAB_00188d9d;
    }
    uVar3 = (uint)(key >> (bVar6 & 0x3f)) & 1;
    n = (PTrieNode *)(pPVar1->childNodes + (int)uVar3);
    x = (uintptr_t)(pPVar1->keys + (int)uVar3);
  } while( true );
}

Assistant:

static bool ptrie_insert(PTrie* ptrie, uintptr_t key, uintptr_t value)
{
	SPINLOCK_ACQUIRE(&ptrie->lock);
	// First get a new node.
	// The nodes are stored in memory pages allocated for that single purpose. Free nodes are arranged in a free list
	// (the first bytes in the node points to the next free page). The last bytes of the page are used to point to the
	// next free page, in case several pages where allocated at the same time by different threads.
	PTrieNode* newNode;
	if (ptrie->freeNodesList)
		ptrie->freeNodesList = *(PTrieNode**)(newNode = ptrie->freeNodesList);
	else if (ptrie->newAllocatedPage) {
		newNode = ptrie->newAllocatedPage;
		if (!((uintptr_t)++ptrie->newAllocatedPage & (LTALLOC_VMALLOC_MIN_SIZE() - 1)))
			ptrie->newAllocatedPage = ((PTrieNode**)ptrie->newAllocatedPage)[-1];
	}
	else {
		SPINLOCK_RELEASE(&ptrie->lock);
		newNode = (PTrieNode*)LTALLOC_VMALLOC(LTALLOC_VMALLOC_MIN_SIZE());
		if (unlikely(!newNode)) { return false; }
		LTALLOC_ASSERT(((char**)((char*)newNode + LTALLOC_VMALLOC_MIN_SIZE()))[-1] == 0);
		SPINLOCK_ACQUIRE(&ptrie->lock);
		((PTrieNode**)((char*)newNode + LTALLOC_VMALLOC_MIN_SIZE()))[-1] = ptrie->newAllocatedPage;//in case if other thread also have just allocated a new page
		ptrie->newAllocatedPage = newNode + 1;
	}
	// Then, insert it.
	PTrieNode** node = &ptrie->root, * n;
	uintptr_t* prevKey = NULL, x, pkey;
	unsigned int index, b;
	LTALLOC_ASSERT(!((value & 1) | (key & 0xFF)));//check constraints for key/value
	for (;;)
	{
		n = *node;
		if (!((uintptr_t)n & 1))//not a leaf
		{
			int prefixEnd = n->keys[0] & 0xFF;
			x = key ^ n->keys[0];// & ~0xFF;
			if (!(x & (~(uintptr_t)1 << prefixEnd))) {//prefix matches, so go on
				int branch = (key >> prefixEnd) & 1;
				node = &n->childNodes[branch];
				prevKey = &n->keys[branch];
			}
			else {//insert a new node before current
				pkey = n->keys[0] & ~0xFF;
				break;
			}
		}
		else {//leaf
			if (*node == PTRIE_NULL_NODE) {
				*node = newNode;
				newNode->keys[0] = key;//left prefixEnd = 0, so all following insertions will be before this node
				newNode->childNodes[0] = (PTrieNode*)(value | 1);
				newNode->childNodes[1] = PTRIE_NULL_NODE;
				SPINLOCK_RELEASE(&ptrie->lock);
				return true;
			}
			else {
				pkey = *prevKey & ~0xFF;
				x = key ^ pkey;
				LTALLOC_ASSERT(x/*key != pkey*/ && "key already inserted");
				break;
			}
		}
	}
	BSR(index, x);
	b = (key >> index) & 1;
	newNode->keys[b] = key;
	newNode->keys[b ^ 1] = pkey;
	newNode->keys[0] |= index;
	newNode->childNodes[b] = (PTrieNode*)(value | 1);
	newNode->childNodes[b ^ 1] = n;
	*node = newNode;
	SPINLOCK_RELEASE(&ptrie->lock);
	return true;
}